

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

uint32_t readFractionalPart(uint32_t integer)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  __type _Var4;
  double dVar5;
  uint32_t fractional;
  int c;
  anon_enum_32 state;
  uint uStack_10;
  uint8_t precision;
  uint32_t divisor;
  uint32_t value;
  uint32_t integer_local;
  
  uStack_10 = 0;
  state = READFRACTIONALPART_PRECISION;
  c._3_1_ = 0;
  fractional = 0;
  do {
    iVar1 = peek();
    if (fractional == 0) {
      if (iVar1 != 0x5f) {
        if ((iVar1 == 0x71) || (iVar1 == 0x51)) {
          fractional = 1;
        }
        else {
          if ((iVar1 < 0x30) || (0x39 < iVar1)) goto LAB_00111e0b;
          uVar2 = -(iVar1 + -0x30) - 1;
          if (uVar2 / 10 < state) {
            warning(WARNING_LARGE_CONSTANT,"Precision of fixed-point constant is too large\n",
                    (ulong)uVar2 % 10);
            shiftChar();
            while( true ) {
              iVar1 = peek();
              if ((iVar1 < 0x30) || (bVar3 = true, 0x39 < iVar1)) {
                bVar3 = iVar1 == 0x5f;
              }
              if (!bVar3) break;
              shiftChar();
            }
LAB_00111e0b:
            if (c._3_1_ == 0) {
              if (fractional != 0) {
                error("Invalid fixed-point constant, no significant digits after \'q\'\n");
              }
              c._3_1_ = fixPrecision;
            }
            else if (0x1f < c._3_1_) {
              error("Fixed-point constant precision must be between 1 and 31\n");
              c._3_1_ = fixPrecision;
            }
            if ((ulong)(1L << (0x20 - c._3_1_ & 0x3f)) <= (ulong)integer) {
              warning(WARNING_LARGE_CONSTANT,"Magnitude of fixed-point constant is too large\n");
            }
            _Var4 = std::pow<double,unsigned_char>(2.0,c._3_1_);
            dVar5 = round(((double)uStack_10 / (double)state) * _Var4);
            return integer << (c._3_1_ & 0x1f) | (uint)(long)dVar5;
          }
          uStack_10 = uStack_10 * 10 + iVar1 + -0x30;
          state = state * 10;
        }
      }
    }
    else if ((iVar1 == 0x2e) && (fractional == 1)) {
      fractional = 2;
    }
    else {
      if ((iVar1 < 0x30) || (0x39 < iVar1)) goto LAB_00111e0b;
      c._3_1_ = c._3_1_ * '\n' + (char)iVar1 + -0x30;
    }
    shiftChar();
  } while( true );
}

Assistant:

static uint32_t readFractionalPart(uint32_t integer)
{
	uint32_t value = 0, divisor = 1;
	uint8_t precision = 0;
	enum {
		READFRACTIONALPART_DIGITS,
		READFRACTIONALPART_PRECISION,
		READFRACTIONALPART_PRECISION_DIGITS,
	} state = READFRACTIONALPART_DIGITS;

	for (;; shiftChar()) {
		int c = peek();

		if (state == READFRACTIONALPART_DIGITS) {
			if (c == '_') {
				continue;
			} else if (c == 'q' || c == 'Q') {
				state = READFRACTIONALPART_PRECISION;
				continue;
			} else if (c < '0' || c > '9') {
				break;
			}
			if (divisor > (UINT32_MAX - (c - '0')) / 10) {
				warning(WARNING_LARGE_CONSTANT,
					"Precision of fixed-point constant is too large\n");
				// Discard any additional digits
				shiftChar();
				while (c = peek(), (c >= '0' && c <= '9') || c == '_')
					shiftChar();
				break;
			}
			value = value * 10 + (c - '0');
			divisor *= 10;
		} else {
			if (c == '.' && state == READFRACTIONALPART_PRECISION) {
				state = READFRACTIONALPART_PRECISION_DIGITS;
				continue;
			} else if (c < '0' || c > '9') {
				break;
			}
			precision = precision * 10 + (c - '0');
		}
	}

	if (precision == 0) {
		if (state >= READFRACTIONALPART_PRECISION)
			error("Invalid fixed-point constant, no significant digits after 'q'\n");
		precision = fixPrecision;
	} else if (precision > 31) {
		error("Fixed-point constant precision must be between 1 and 31\n");
		precision = fixPrecision;
	}

	if (integer >= ((uint64_t)1 << (32 - precision)))
		warning(WARNING_LARGE_CONSTANT, "Magnitude of fixed-point constant is too large\n");

	// Cast to unsigned avoids undefined overflow behavior
	uint32_t fractional = (uint32_t)round((double)value / divisor * pow(2.0, precision));

	return (integer << precision) | fractional;
}